

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

ElementDocument * __thiscall
Rml::Context::LoadDocumentFromMemory(Context *this,String *string,String *source_url)

{
  byte *_buffer;
  size_t _buffer_size;
  tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_> this_00;
  ElementDocument *pEVar1;
  UniquePtr<Rml::StreamMemory> stream;
  __uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_168;
  URL local_160;
  
  _buffer = (byte *)(string->_M_dataplus)._M_p;
  _buffer_size = string->_M_string_length;
  this_00.super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
  super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
       operator_new(0x170);
  StreamMemory::StreamMemory
            ((StreamMemory *)
             this_00.
             super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
             super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,_buffer,_buffer_size);
  local_168._M_t.
  super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
  super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
       (tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
       (tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
       this_00.super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
       super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl;
  URL::URL(&local_160,source_url);
  StreamMemory::SetSourceURL
            ((StreamMemory *)
             this_00.
             super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
             super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,&local_160);
  URL::~URL(&local_160);
  pEVar1 = LoadDocument(this,(Stream *)
                             local_168._M_t.
                             super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                             .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl);
  ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
            ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)&local_168);
  return pEVar1;
}

Assistant:

ElementDocument* Context::LoadDocumentFromMemory(const String& string, const String& source_url)
{
	// Open the stream based on the string contents.
	auto stream = MakeUnique<StreamMemory>(reinterpret_cast<const byte*>(string.c_str()), string.size());

	stream->SetSourceURL(source_url);

	// Load the document from the stream.
	ElementDocument* document = LoadDocument(stream.get());

	return document;
}